

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Element::Element(Element *this,Token *key_token,Parser *parser)

{
  TokenType TVar1;
  uint uVar2;
  uint uVar3;
  TokenPtr pTVar4;
  Scope *this_00;
  bool bVar5;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  TokenType local_90;
  allocator local_89;
  TokenType ty;
  Token *local_68;
  TokenPtr prev;
  string local_58;
  value_type local_28;
  TokenPtr n;
  Parser *parser_local;
  Token *key_token_local;
  Element *this_local;
  
  this->key_token = key_token;
  n = (TokenPtr)parser;
  parser_local = (Parser *)key_token;
  key_token_local = (Token *)this;
  std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::vector
            (&this->tokens);
  std::unique_ptr<Assimp::FBX::Scope,std::default_delete<Assimp::FBX::Scope>>::
  unique_ptr<std::default_delete<Assimp::FBX::Scope>,void>
            ((unique_ptr<Assimp::FBX::Scope,std::default_delete<Assimp::FBX::Scope>> *)
             &this->compound);
  local_28 = (Token *)0x0;
  do {
    local_28 = Parser::AdvanceToNextToken((Parser *)n);
    if (local_28 == (TokenPtr)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_58,"unexpected end of file, expected closing bracket",
                 (allocator *)((long)&prev + 7));
      pTVar4 = Parser::LastToken((Parser *)n);
      anon_unknown.dwarf_1924db::ParseError(&local_58,pTVar4);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)((long)&prev + 7));
    }
    TVar1 = Token::Type(local_28);
    if (TVar1 == TokenType_DATA) {
      std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
      push_back(&this->tokens,&local_28);
      local_68 = local_28;
      local_28 = Parser::AdvanceToNextToken((Parser *)n);
      if (local_28 == (TokenPtr)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&ty,"unexpected end of file, expected bracket, comma or key",&local_89)
        ;
        pTVar4 = Parser::LastToken((Parser *)n);
        anon_unknown.dwarf_1924db::ParseError((string *)&ty,pTVar4);
        std::__cxx11::string::~string((string *)&ty);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      local_90 = Token::Type(local_28);
      if ((local_90 != TokenType_DATA) || (TVar1 = Token::Type(local_68), TVar1 != TokenType_DATA))
      {
LAB_001bdec6:
        if ((((local_90 != TokenType_OPEN_BRACKET) && (local_90 != TokenType_CLOSE_BRACKET)) &&
            (local_90 != TokenType_COMMA)) && (local_90 != TokenType_KEY)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_b0,"unexpected token; expected bracket, comma or key",
                     &local_b1);
          anon_unknown.dwarf_1924db::ParseError(&local_b0,local_28);
          std::__cxx11::string::~string((string *)&local_b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        }
        goto LAB_001bdf8e;
      }
      uVar2 = Token::Line(local_28);
      uVar3 = Token::Line(local_68);
      if (uVar2 != uVar3 + 1) goto LAB_001bdec6;
      std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
      push_back(&this->tokens,&local_28);
    }
    else {
LAB_001bdf8e:
      TVar1 = Token::Type(local_28);
      if (TVar1 == TokenType_OPEN_BRACKET) {
        this_00 = (Scope *)operator_new(0x30);
        Scope::Scope(this_00,(Parser *)n,false);
        std::unique_ptr<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::reset
                  (&this->compound,this_00);
        local_28 = Parser::CurrentToken((Parser *)n);
        TVar1 = Token::Type(local_28);
        if (TVar1 != TokenType_CLOSE_BRACKET) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_d8,"expected closing bracket",&local_d9);
          anon_unknown.dwarf_1924db::ParseError(&local_d8,local_28);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        }
        Parser::AdvanceToNextToken((Parser *)n);
        return;
      }
    }
    TVar1 = Token::Type(local_28);
    bVar5 = false;
    if (TVar1 != TokenType_KEY) {
      TVar1 = Token::Type(local_28);
      bVar5 = TVar1 != TokenType_CLOSE_BRACKET;
    }
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

Element::Element(const Token& key_token, Parser& parser)
: key_token(key_token)
{
    TokenPtr n = nullptr;
    do {
        n = parser.AdvanceToNextToken();
        if(!n) {
            ParseError("unexpected end of file, expected closing bracket",parser.LastToken());
        }

        if (n->Type() == TokenType_DATA) {
            tokens.push_back(n);
			TokenPtr prev = n;
            n = parser.AdvanceToNextToken();
            if(!n) {
                ParseError("unexpected end of file, expected bracket, comma or key",parser.LastToken());
            }

			const TokenType ty = n->Type();

			// some exporters are missing a comma on the next line
			if (ty == TokenType_DATA && prev->Type() == TokenType_DATA && (n->Line() == prev->Line() + 1)) {
				tokens.push_back(n);
				continue;
			}

            if (ty != TokenType_OPEN_BRACKET && ty != TokenType_CLOSE_BRACKET && ty != TokenType_COMMA && ty != TokenType_KEY) {
                ParseError("unexpected token; expected bracket, comma or key",n);
            }
        }

        if (n->Type() == TokenType_OPEN_BRACKET) {
            compound.reset(new Scope(parser));

            // current token should be a TOK_CLOSE_BRACKET
            n = parser.CurrentToken();
            ai_assert(n);

            if (n->Type() != TokenType_CLOSE_BRACKET) {
                ParseError("expected closing bracket",n);
            }

            parser.AdvanceToNextToken();
            return;
        }
    }
    while(n->Type() != TokenType_KEY && n->Type() != TokenType_CLOSE_BRACKET);
}